

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O2

void __thiscall
AssemblyCode::DivRegRegCommand::DivRegRegCommand
          (DivRegRegCommand *this,CTemp *leftOperand,CTemp *rightOperand)

{
  (this->super_AssemblyCommand)._vptr_AssemblyCommand = (_func_int **)&PTR_GetIn_0017ccc0;
  std::__cxx11::string::string((string *)&this->leftOperand,(string *)leftOperand);
  std::__cxx11::string::string((string *)&this->rightOperand,(string *)rightOperand);
  return;
}

Assistant:

AssemblyCode::DivRegRegCommand::DivRegRegCommand( const IRT::CTemp leftOperand, const IRT::CTemp rightOperand )
        : leftOperand( leftOperand ), rightOperand( rightOperand ) { }